

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

Segment * reflection(Segment *segment,Sphere *sphere)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  Segment *in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar2 = (segment->b).x;
  uVar3 = (segment->b).y;
  fVar1 = (segment->b).z;
  fVar7 = sphere->radius;
  fVar5 = ((float)uVar2 - (sphere->center).x) / fVar7;
  fVar6 = ((float)uVar3 - (sphere->center).y) / fVar7;
  fVar7 = (fVar1 - (sphere->center).z) / fVar7;
  fVar8 = SQRT(fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6);
  fVar9 = (float)uVar2 - (segment->a).x;
  fVar10 = (float)uVar3 - (segment->a).y;
  fVar11 = fVar1 - (segment->a).z;
  fVar12 = SQRT(fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10);
  fVar13 = (fVar11 / fVar12) * (fVar7 / fVar8) +
           (fVar9 / fVar12) * (fVar5 / fVar8) + (fVar6 / fVar8) * (fVar10 / fVar12);
  fVar13 = fVar13 + fVar13;
  (in_RDI->a).z = (segment->b).z;
  fVar4 = (segment->b).y;
  (in_RDI->a).x = (segment->b).x;
  (in_RDI->a).y = fVar4;
  (in_RDI->b).x = (fVar9 / fVar12 - (fVar5 / fVar8) * fVar13) + (float)uVar2;
  (in_RDI->b).y = (fVar10 / fVar12 - (fVar6 / fVar8) * fVar13) + (float)uVar3;
  (in_RDI->b).z = (fVar11 / fVar12 - fVar13 * (fVar7 / fVar8)) + fVar1;
  return in_RDI;
}

Assistant:

Segment reflection(Segment const& segment, Sphere const& sphere)
{
  Point normalVector = normalize((segment.b - sphere.center) / sphere.radius);

  Vector ri = normalize(segment.b - segment.a);
  float dot = dotProduct(ri, normalVector);
  ri -= normalVector * (2 * dot);

  return {segment.b, segment.b + ri};
}